

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep_context.cc
# Opt level: O0

void __thiscall p2t::SweepContext::~SweepContext(SweepContext *this)

{
  Point *pPVar1;
  AdvancingFront *this_00;
  bool bVar2;
  reference ppTVar3;
  size_type sVar4;
  reference ppEVar5;
  uint local_2c;
  uint i;
  Triangle *ptr;
  _Self local_18;
  iterator iter;
  SweepContext *this_local;
  
  pPVar1 = this->head_;
  iter._M_node = (_List_node_base *)this;
  if (pPVar1 != (Point *)0x0) {
    Point::~Point(pPVar1);
    operator_delete(pPVar1);
  }
  pPVar1 = this->tail_;
  if (pPVar1 != (Point *)0x0) {
    Point::~Point(pPVar1);
    operator_delete(pPVar1);
  }
  this_00 = this->front_;
  if (this_00 != (AdvancingFront *)0x0) {
    AdvancingFront::~AdvancingFront(this_00);
    operator_delete(this_00);
  }
  if (this->af_head_ != (Node *)0x0) {
    operator_delete(this->af_head_);
  }
  if (this->af_middle_ != (Node *)0x0) {
    operator_delete(this->af_middle_);
  }
  if (this->af_tail_ != (Node *)0x0) {
    operator_delete(this->af_tail_);
  }
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::list<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>::begin(&this->map_);
  while( true ) {
    ptr = (Triangle *)
          std::__cxx11::list<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>::end(&this->map_);
    bVar2 = std::operator!=(&local_18,(_Self *)&ptr);
    if (!bVar2) break;
    ppTVar3 = std::_List_iterator<p2t::Triangle_*>::operator*(&local_18);
    if (*ppTVar3 != (Triangle *)0x0) {
      operator_delete(*ppTVar3);
    }
    std::_List_iterator<p2t::Triangle_*>::operator++(&local_18);
  }
  local_2c = 0;
  while( true ) {
    sVar4 = std::vector<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>::size(&this->edge_list);
    if (sVar4 <= local_2c) break;
    ppEVar5 = std::vector<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>::operator[]
                        (&this->edge_list,(ulong)local_2c);
    if (*ppEVar5 != (value_type)0x0) {
      operator_delete(*ppEVar5);
    }
    local_2c = local_2c + 1;
  }
  std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>::~vector(&this->points_);
  std::__cxx11::list<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>::~list(&this->map_);
  std::vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>::~vector(&this->triangles_);
  std::vector<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>::~vector(&this->edge_list);
  return;
}

Assistant:

SweepContext::~SweepContext()
{

    // Clean up memory

    delete head_;
    delete tail_;
    delete front_;
    delete af_head_;
    delete af_middle_;
    delete af_tail_;

    typedef std::list<Triangle*> type_list;

    for(type_list::iterator iter = map_.begin(); iter != map_.end(); ++iter) {
        Triangle* ptr = *iter;
        delete ptr;
    }

     for(unsigned int i = 0; i < edge_list.size(); i++) {
        delete edge_list[i];
    }

}